

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer ppVar1;
  bool init_info;
  bool init_config;
  int iVar2;
  Config *pCVar3;
  EVP_PKEY_CTX *pEVar4;
  Info *this;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *property;
  pointer ppVar5;
  string_view key;
  string_view value;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  updated_properties;
  int option_index;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  undefined4 local_74;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_74 = 0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  init_info = true;
  init_config = true;
switchD_00121cce_caseD_63:
  while( true ) {
    iVar2 = getopt_long(argc,argv,"-bha:C:i:",main::opts,&local_74);
    if (0x60 < iVar2) goto code_r0x00121cc7;
    if (iVar2 == -1) {
      Sysfex::import_config(init_config,init_info);
      ppVar1 = local_98.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar5 = local_98.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1
          ) {
        pCVar3 = Config::the();
        key._M_str = (ppVar5->first)._M_dataplus._M_p;
        key._M_len = (ppVar5->first)._M_string_length;
        value._M_str = (ppVar5->second)._M_dataplus._M_p;
        value._M_len = (ppVar5->second)._M_string_length;
        Config::set_property(pCVar3,key,value);
      }
      Sysfex::run();
      goto LAB_00121e25;
    }
    if (iVar2 == 0x3f) break;
    if (iVar2 == 0x43) {
      pCVar3 = Config::the();
      pEVar4 = (EVP_PKEY_CTX *)strlen(_optarg);
      init_config = false;
      Config::init(pCVar3,pEVar4);
    }
  }
  iVar2 = 1;
  Sysfex::help();
  goto LAB_00121e27;
code_r0x00121cc7:
  switch(iVar2) {
  case 0x61:
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[6],_char_*&,_true>(&local_70,(char (*) [6])0x13484e,(char **)&optarg);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&local_98,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
      operator_delete(local_70.second._M_dataplus._M_p,
                      local_70.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
      operator_delete(local_70.first._M_dataplus._M_p,
                      local_70.first.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0x62:
    Sysfex::about();
LAB_00121e25:
    iVar2 = 0;
LAB_00121e27:
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_98);
    return iVar2;
  case 0x68:
    Sysfex::help();
    goto LAB_00121e25;
  case 0x69:
    this = Info::the();
    pEVar4 = (EVP_PKEY_CTX *)strlen(_optarg);
    init_info = false;
    Info::init(this,pEVar4);
  }
  goto switchD_00121cce_caseD_63;
}

Assistant:

int main(int argc, char *argv[]) {
  bool init_config = true;
  bool init_info = true;

  int opt = 0;
  int option_index = 0;
  const char *optstring = "-bha:C:i:";
  static const struct option opts[] = {
    {"about",  no_argument,       0, 'b'},
    {"help",   no_argument,       0, 'h'},
    {"ascii",  required_argument, 0, 'a'},
    {"config", required_argument, 0, 'C'},
    {"info",   required_argument, 0, 'i'},
    {0, 0, 0, 0}
  };

  std::vector<std::pair<std::string, std::string>> updated_properties;

  while ((opt = getopt_long(argc, argv, optstring, opts, &option_index)) != -1) {
    switch (opt) {
      case 0:
        break;
      case '?':
        Sysfex::help();
        return 1;

      case 'b':
        Sysfex::about();
        return 0;

      case 'h':
        Sysfex::help();
        return 0;

      case 'a':
        updated_properties.push_back({"ascii", optarg});
        break;

      case 'i':
        Info::the()->init(optarg);
        init_info = false;
        break;

      case 'C':
        Config::the()->init(optarg);
        init_config = false;
        break;
    }
  }

  Sysfex::import_config(init_config, init_info);
  for (const auto &property : updated_properties) {
    Config::the()->set_property(property.first, property.second);
  }

  Sysfex::run();
  return 0;
}